

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O3

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::destroySslContext(TlsCryptographOpenSSL *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->ssl != (SSL *)0x0) {
    iVar2 = q_SSL_in_init(this->ssl);
    if (((iVar2 == 0) && (this->systemOrSslErrorDetected == false)) &&
       (iVar2 = q_SSL_shutdown(this->ssl), iVar2 != 1)) {
      QTlsBackendOpenSSL::getErrorsFromOpenSsl();
      LOCK();
      _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
      UNLOCK();
      if (_DAT_aaaaaaaaaaaaaaaa == 0) {
        QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,2,0x10);
      }
    }
    q_SSL_free(this->ssl);
    this->ssl = (SSL *)0x0;
  }
  this_00 = (this->sslContextPointer).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->sslContextPointer).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sslContextPointer).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TlsCryptographOpenSSL::destroySslContext()
{
    if (ssl) {
        if (!q_SSL_in_init(ssl) && !systemOrSslErrorDetected) {
            // We do not send a shutdown alert here. Just mark the session as
            // resumable for qhttpnetworkconnection's "optimization", otherwise
            // OpenSSL won't start a session resumption.
            if (q_SSL_shutdown(ssl) != 1) {
                // Some error may be queued, clear it.
                const auto errors = QTlsBackendOpenSSL::getErrorsFromOpenSsl();
                Q_UNUSED(errors);
            }
        }
        q_SSL_free(ssl);
        ssl = nullptr;
    }
    sslContextPointer.reset();
}